

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::assemble::COOMatrix<double>::makeDense
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,COOMatrix<double> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double *pdVar3;
  pointer pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scalar *pSVar7;
  ostream *poVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ActualDstType actualDst;
  pointer pTVar12;
  double __tmp;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  double local_1b8;
  undefined1 local_1b0 [16];
  scalar_constant_op<double> local_1a0;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(ulong)this->rows_,
             (ulong)this->cols_);
  local_218._M_dataplus._M_p = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_1b0,
                   (__return_storage_ptr__->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows,(__return_storage_ptr__->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_cols,(scalar_constant_op<double> *)&local_218);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
            (__return_storage_ptr__,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_1b0,(assign_op<double,_double> *)&local_218);
  auVar6 = _DAT_00446080;
  auVar5 = _DAT_00446070;
  lVar9 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows *
          (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols;
  if (0 < lVar9) {
    pdVar3 = (__return_storage_ptr__->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    uVar10 = lVar9 + 0x1fffffffffffffff;
    uVar11 = uVar10 & 0x1fffffffffffffff;
    auVar13._8_4_ = (int)uVar11;
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = (int)(uVar11 >> 0x20);
    lVar9 = 0;
    auVar13 = auVar13 ^ _DAT_00446080;
    do {
      auVar14._8_4_ = (int)lVar9;
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar14 = (auVar14 | auVar5) ^ auVar6;
      if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                  auVar13._4_4_ < auVar14._4_4_) & 1)) {
        pdVar3[lVar9] = local_1a0.m_other;
      }
      if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
          auVar14._12_4_ <= auVar13._12_4_) {
        pdVar3[lVar9 + 1] = local_1a0.m_other;
      }
      lVar9 = lVar9 + 2;
    } while ((uVar11 - ((uint)uVar10 & 1)) + 2 != lVar9);
  }
  pTVar12 = (this->triplets_).
            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (this->triplets_).
           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pTVar12 == pTVar4) {
      return __return_storage_ptr__;
    }
    if ((this->cols_ <= (uint)pTVar12->m_col) || (this->rows_ <= (uint)pTVar12->m_row)) break;
    local_1b8 = pTVar12->m_value;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,(long)pTVar12->m_row,(long)pTVar12->m_col);
    *pSVar7 = local_1b8 + *pSVar7;
    pTVar12 = pTVar12 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Illegal triplet index (",0x17);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_1a0,pTVar12->m_col);
  local_218._M_dataplus._M_p._0_1_ = 0x2c;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,pTVar12->m_row);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"((trp.col() < cols_) && (trp.row() < rows_))","");
  paVar2 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_218,&local_1f8,0xc2,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"false","");
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,"");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  base::AssertionFailed(&local_218,&local_1f8,0xc2,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<Scalar, Eigen::Dynamic, Eigen::Dynamic>
  makeDense() const {
    Eigen::Matrix<Scalar, Eigen::Dynamic, Eigen::Dynamic> mat(rows_, cols_);
    mat.setZero();
    for (const Triplet &trp : triplets_) {
      LF_ASSERT_MSG(
          ((trp.col() < cols_) && (trp.row() < rows_)),
          "Illegal triplet index (" << trp.col() << ',' << trp.row() << ")");
      mat(trp.row(), trp.col()) += trp.value();
    }
    return mat;
  }